

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::RunCrossover(LpSolver *this)

{
  bool bVar1;
  Int IVar2;
  Int IVar3;
  value_type vVar4;
  size_t sVar5;
  char *pcVar6;
  double *pdVar7;
  reference pvVar8;
  ostream *poVar9;
  Basis *this_00;
  Control *in_RDI;
  double dVar10;
  double dVar11;
  Info *in_stack_000000e8;
  vector<int,_std::allocator<int>_> *in_stack_000000f0;
  Vector *in_stack_000000f8;
  Vector *in_stack_00000100;
  Vector *in_stack_00000108;
  Model *in_stack_00000110;
  size_t j;
  Crossover crossover;
  double *weights;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  double *in_stack_000002c8;
  Vector *in_stack_000002d0;
  Vector *in_stack_000002d8;
  Vector *in_stack_000002e0;
  Basis *in_stack_000002e8;
  Crossover *in_stack_000002f0;
  Info *in_stack_00000300;
  Control *d;
  Basis *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  valarray<double> *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  Vector *in_stack_fffffffffffffe40;
  string *psVar12;
  Vector *in_stack_fffffffffffffe48;
  Model *in_stack_fffffffffffffe50;
  Vector *in_stack_fffffffffffffe88;
  Vector *in_stack_fffffffffffffe90;
  Vector *in_stack_fffffffffffffe98;
  Basis *in_stack_fffffffffffffea0;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  char *pcVar13;
  char *text;
  Crossover local_50;
  double *local_28;
  Vector *local_20;
  Vector *local_18;
  Int local_10;
  Int local_c;
  
  local_c = Model::rows((Model *)&in_RDI[1].field_0x1d0);
  local_10 = Model::cols((Model *)&in_RDI[1].field_0x1d0);
  local_18 = Model::lb((Model *)&in_RDI[1].field_0x1d0);
  local_20 = Model::ub((Model *)&in_RDI[1].field_0x1d0);
  local_28 = (double *)0x0;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x837735);
  sVar5 = std::valarray<double>::size
                    ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x60);
  if (sVar5 != 0) {
    local_28 = std::valarray<double>::operator[]
                         ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x60,0);
  }
  Crossover::Crossover(&local_50,in_RDI);
  std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::get
            ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)in_stack_fffffffffffffe10);
  d = in_RDI + 1;
  Crossover::PushAll(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,
                     in_stack_000002d0,in_stack_000002c8,in_stack_00000300);
  dVar10 = Crossover::time_primal(&local_50);
  dVar11 = Crossover::time_dual(&local_50);
  *(double *)&in_RDI[1].field_0x100 = dVar10 + dVar11;
  IVar2 = Crossover::primal_pivots(&local_50);
  IVar3 = Crossover::dual_pivots(&local_50);
  *(Int *)&in_RDI[1].parameters_.super_ipx_parameters.centring_alpha_scaling = IVar2 + IVar3;
  if (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.logfile == 1) {
    std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
              ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x8378d0);
    Basis::ComputeBasicSolution
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    pcVar13 = (char *)0x0;
    while (text = pcVar13,
          pcVar6 = (char *)std::vector<int,_std::allocator<int>_>::size
                                     ((vector<int,_std::allocator<int>_> *)
                                      &in_RDI[1].dummy_.super_ostream.field_0x70), pcVar13 < pcVar6)
    {
      std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
                ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x837978);
      bVar1 = Basis::IsBasic(in_stack_fffffffffffffe10,(Int)((ulong)d >> 0x20));
      if (bVar1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[1].dummy_.super_ostream.field_0x70,(size_type)text);
        *pvVar8 = 0;
      }
      else {
        pdVar7 = std::valarray<double>::operator[](local_18,(size_t)text);
        dVar10 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[](local_20,(size_t)text);
        if ((dVar10 != *pdVar7) || (NAN(dVar10) || NAN(*pdVar7))) {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                              (size_t)text);
          dVar10 = *pdVar7;
          pdVar7 = std::valarray<double>::operator[](local_18,(size_t)text);
          if ((dVar10 != *pdVar7) || (NAN(dVar10) || NAN(*pdVar7))) {
            pdVar7 = std::valarray<double>::operator[]
                               ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                                (size_t)text);
            dVar10 = *pdVar7;
            pdVar7 = std::valarray<double>::operator[](local_20,(size_t)text);
            if ((dVar10 != *pdVar7) || (NAN(dVar10) || NAN(*pdVar7))) {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &in_RDI[1].dummy_.super_ostream.field_0x70,(size_type)text);
              *pvVar8 = -3;
            }
            else {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  &in_RDI[1].dummy_.super_ostream.field_0x70,(size_type)text);
              *pvVar8 = -2;
            }
          }
          else {
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &in_RDI[1].dummy_.super_ostream.field_0x70,(size_type)text);
            *pvVar8 = -1;
          }
        }
        else {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x50,
                              (size_t)text);
          vVar4 = -2;
          if (0.0 <= *pdVar7) {
            vVar4 = -1;
          }
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &in_RDI[1].dummy_.super_ostream.field_0x70,(size_type)text);
          *pvVar8 = vVar4;
        }
      }
      pcVar13 = *(char (*) [35])text + 1;
    }
    poVar9 = Control::Debug(in_RDI,1);
    psVar12 = local_78;
    Textline<char[35]>((char (*) [35])text);
    poVar9 = std::operator<<(poVar9,psVar12);
    PrimalInfeasibility(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    sci2_abi_cxx11_((double)d);
    poVar9 = std::operator<<(poVar9,local_a8);
    poVar9 = std::operator<<(poVar9,'\n');
    Textline<char[39]>((char (*) [39])text);
    this_00 = (Basis *)std::operator<<(poVar9,local_c8);
    DualInfeasibility(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40)
    ;
    sci2_abi_cxx11_((double)d);
    poVar9 = std::operator<<((ostream *)this_00,local_e8);
    std::operator<<(poVar9,'\n');
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_78);
    poVar9 = Control::Debug(in_RDI,1);
    psVar12 = local_108;
    Textline<char[40]>((char (*) [40])text);
    poVar9 = std::operator<<(poVar9,psVar12);
    std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
              ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x837d78);
    Basis::MinSingularValue(this_00);
    sci2_abi_cxx11_((double)d);
    poVar9 = std::operator<<(poVar9,local_128);
    std::operator<<(poVar9,'\n');
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_108);
    Model::EvaluateBasicSolution
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8);
    dVar10 = *(double *)&in_RDI[1].parameters_.super_ipx_parameters.stop_at_switch;
    dVar11 = Control::pfeasibility_tol(in_RDI);
    if (dVar10 <= dVar11) {
      dVar10 = *(double *)&in_RDI[1].parameters_.super_ipx_parameters.maxpasses;
      dVar11 = Control::dfeasibility_tol(in_RDI);
      if (dVar10 <= dVar11) {
        return;
      }
    }
    *(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.logfile = 2;
  }
  else {
    std::valarray<double>::resize
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10
              );
    std::valarray<double>::resize
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10
              );
    std::valarray<double>::resize
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10
              );
  }
  return;
}

Assistant:

void LpSolver::RunCrossover() {
    assert(basis_);
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const double *weights = NULL;
    basic_statuses_.clear();

    if (crossover_weights_.size()) {
        assert((Int)crossover_weights_.size() == n+m);
        weights = &crossover_weights_[0];
    }

    Crossover crossover(control_);
    crossover.PushAll(basis_.get(), x_crossover_, y_crossover_, z_crossover_,
                      weights, &info_);
    info_.time_crossover =
        crossover.time_primal() + crossover.time_dual();
    info_.updates_crossover =
        crossover.primal_pivots() + crossover.dual_pivots();
    if (info_.status_crossover != IPX_STATUS_optimal) {
        // Crossover failed. Discard solution.
        x_crossover_.resize(0);
        y_crossover_.resize(0);
        z_crossover_.resize(0);
        return;
    }

    // Recompute vertex solution and set basic statuses.
    basis_->ComputeBasicSolution(x_crossover_, y_crossover_, z_crossover_);
    basic_statuses_.resize(n+m);
    for (size_t j = 0; j < basic_statuses_.size(); j++) {
        if (basis_->IsBasic(j)) {
            basic_statuses_[j] = IPX_basic;
        } else {
            if (lb[j] == ub[j])
                basic_statuses_[j] = z_crossover_[j] >= 0.0 ?
                    IPX_nonbasic_lb : IPX_nonbasic_ub;
            else if (x_crossover_[j] == lb[j])
                basic_statuses_[j] = IPX_nonbasic_lb;
            else if (x_crossover_[j] == ub[j])
                basic_statuses_[j] = IPX_nonbasic_ub;
            else
                basic_statuses_[j] = IPX_superbasic;
        }
    }
    control_.Debug()
        << Textline("Bound violation of basic solution:")
        << sci2(PrimalInfeasibility(model_, x_crossover_)) << '\n'
        << Textline("Dual sign violation of basic solution:")
        << sci2(DualInfeasibility(model_, x_crossover_, z_crossover_)) << '\n';
    control_.Debug()
        << Textline("Minimum singular value of basis matrix:")
        << sci2(basis_->MinSingularValue()) << '\n';

    // Declare crossover status "imprecise" if the vertex solution defined by
    // the final basis does not satisfy tolerances.
    model_.EvaluateBasicSolution(x_crossover_, y_crossover_, z_crossover_,
                                 basic_statuses_, &info_);
    if (info_.primal_infeas > control_.pfeasibility_tol() ||
        info_.dual_infeas > control_.dfeasibility_tol())
        info_.status_crossover = IPX_STATUS_imprecise;
}